

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

void __thiscall
QLocalSocketPrivate::_q_errorOccurred(QLocalSocketPrivate *this,SocketError socketError)

{
  long lVar1;
  QLatin1StringView latin1;
  QLocalSocket *pQVar2;
  undefined4 in_ESI;
  QLocalSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  LocalSocketError error;
  QLocalSocket *q;
  QString errorString;
  QString function;
  LocalSocketError _t1;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffa8;
  Data *local_28;
  QString *function_00;
  LocalSocketError error_00;
  QLocalSocketPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  _t1 = 0xaaaaaaaa;
  error_00 = 0xaaaaaaaa;
  local_28 = (Data *)0xaaaaaaaaaaaaaaaa;
  function_00 = (QString *)0xaaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff78,(size_t)in_RDI);
  latin1.m_data._0_4_ = in_stack_ffffffffffffffa8;
  latin1.m_size = (qsizetype)pQVar2;
  latin1.m_data._4_4_ = in_ESI;
  QString::QString((QString *)&local_28,latin1);
  generateErrorString(in_stack_fffffffffffffff0,error_00,function_00);
  QIODevice::setErrorString((QString *)pQVar2);
  QLocalSocket::errorOccurred((QLocalSocket *)0x386f56,_t1);
  QString::~QString((QString *)0x386f60);
  QString::~QString((QString *)0x386f6a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::_q_errorOccurred(QAbstractSocket::SocketError socketError)
{
    Q_Q(QLocalSocket);
    QString function = "QLocalSocket"_L1;
    QLocalSocket::LocalSocketError error = (QLocalSocket::LocalSocketError)socketError;
    QString errorString = generateErrorString(error, function);
    q->setErrorString(errorString);
    emit q->errorOccurred(error);
}